

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cpp
# Opt level: O2

int main(void)

{
  iterator it_00;
  cake_iterator<true> first;
  cake_iterator<true> first_00;
  cake_iterator<true> first_01;
  cake_iterator<false> last;
  cake_iterator<true> last_00;
  cake_iterator<false> last_01;
  cake_iterator<true> last_02;
  cake_iterator<true> last_03;
  cake_iterator<false> last_04;
  cake_iterator<false> last_05;
  undefined1 auVar1 [24];
  undefined1 auVar2 [24];
  undefined1 auVar3 [24];
  undefined1 auVar4 [24];
  int iVar5;
  int iVar6;
  uint value;
  char *pcVar7;
  uint uVar8;
  undefined4 in_stack_ffffffffffffe068;
  undefined4 in_stack_ffffffffffffe06c;
  int iVar9;
  undefined1 in_stack_ffffffffffffe070;
  undefined1 uVar10;
  undefined7 in_stack_ffffffffffffe071;
  undefined8 in_stack_ffffffffffffe078;
  undefined4 in_stack_ffffffffffffe080;
  undefined4 in_stack_ffffffffffffe084;
  int iVar11;
  undefined1 in_stack_ffffffffffffe088;
  undefined1 uVar12;
  undefined7 in_stack_ffffffffffffe089;
  iterator it;
  iterator local_1ed8;
  iterator local_1ec0;
  const_reverse_iterator local_1ea8;
  const_reverse_iterator local_1e90;
  const_iterator local_1e78;
  reverse_iterator local_1e60;
  iterator local_1e48;
  skiplist<int,_std::less<int>_> iskip;
  skiplist<int,_std::less<int>_> uskip;
  skiplist<int,_std::less<int>_> yskip;
  
  skiplist<int,_std::less<int>_>::skiplist(&iskip);
  for (uVar8 = 0; uVar8 != 0x15; uVar8 = uVar8 + 1) {
    if ((uVar8 & 1) == 0) {
      value = uVar8 + 2;
    }
    else {
      value = uVar8 % 7;
    }
    skiplist<int,_std::less<int>_>::insert(&iskip,value);
  }
  operator<<((ostream *)&std::cout,&iskip);
  std::operator<<((ostream *)&std::cout,"Forward iterator :\n");
  skiplist<int,_std::less<int>_>::begin(&local_1e48,&iskip);
  auVar1._4_4_ = in_stack_ffffffffffffe06c;
  auVar1._0_4_ = in_stack_ffffffffffffe068;
  auVar1[8] = in_stack_ffffffffffffe070;
  auVar1._9_7_ = in_stack_ffffffffffffe071;
  auVar1._16_8_ = 0;
  last._8_4_ = in_stack_ffffffffffffe080;
  last.node_count_ = (int)in_stack_ffffffffffffe078;
  last.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last._12_4_ = in_stack_ffffffffffffe084;
  last.node._0_1_ = in_stack_ffffffffffffe088;
  last.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar1 << 0x40),last);
  std::operator<<((ostream *)&std::cout,"Reverse iterator:\n");
  skiplist<int,_std::less<int>_>::rend(&local_1e60,&iskip);
  first._8_4_ = in_stack_ffffffffffffe068;
  first._0_8_ = local_1e60.node;
  first._12_4_ = in_stack_ffffffffffffe06c;
  first.node._0_1_ = in_stack_ffffffffffffe070;
  first.node._1_7_ = in_stack_ffffffffffffe071;
  last_00._8_4_ = in_stack_ffffffffffffe080;
  last_00.node_count_ = (int)in_stack_ffffffffffffe078;
  last_00.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_00._12_4_ = in_stack_ffffffffffffe084;
  last_00.node._0_1_ = in_stack_ffffffffffffe088;
  last_00.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first,last_00);
  std::operator<<((ostream *)&std::cout,"Erasing with iterators:\n");
  skiplist<int,_std::less<int>_>::find(&it,&iskip,3);
  if ((it.node == (SLNode<int> *)0x0) && (it.node_count_ == 0)) {
    pcVar7 = "Something very wrong\n";
  }
  else {
    it_00.node_count_ref_ = it.node_count_ref_;
    it_00.node_count_ = it.node_count_;
    it_00.reverse_ = it.reverse_;
    it_00._9_7_ = it._9_7_;
    it_00.node = it.node;
    skiplist<int,_std::less<int>_>::erase((iterator *)&uskip,&iskip,it_00);
    pcVar7 = "Erased (I think?) \n";
  }
  std::operator<<((ostream *)&std::cout,pcVar7);
  std::operator<<((ostream *)&std::cout,"Forward constant iterator :\n");
  skiplist<int,_std::less<int>_>::cbegin(&local_1e78,&iskip);
  auVar2._4_4_ = in_stack_ffffffffffffe06c;
  auVar2._0_4_ = in_stack_ffffffffffffe068;
  auVar2[8] = in_stack_ffffffffffffe070;
  auVar2._9_7_ = in_stack_ffffffffffffe071;
  auVar2._16_8_ = 0;
  last_01._8_4_ = in_stack_ffffffffffffe080;
  last_01.node_count_ = (int)in_stack_ffffffffffffe078;
  last_01.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_01._12_4_ = in_stack_ffffffffffffe084;
  last_01.node._0_1_ = in_stack_ffffffffffffe088;
  last_01.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar2 << 0x40),last_01);
  std::operator<<((ostream *)&std::cout,"Reverse constant iterator:\n");
  iVar5 = 0;
  if (iskip.last != (SLNode<int> *)0x0) {
    iVar5 = (iskip.last)->count + -1;
  }
  uVar12 = 1;
  iVar11 = iVar5;
  skiplist<int,_std::less<int>_>::crend(&local_1e90,&iskip);
  first_00._8_4_ = in_stack_ffffffffffffe068;
  first_00._0_8_ = local_1e90.node;
  first_00._12_4_ = in_stack_ffffffffffffe06c;
  first_00.node._0_1_ = in_stack_ffffffffffffe070;
  first_00.node._1_7_ = in_stack_ffffffffffffe071;
  last_02._8_4_ = iVar5;
  last_02.node_count_ = (int)in_stack_ffffffffffffe078;
  last_02.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_02._12_4_ = iVar11;
  last_02.node._0_1_ = uVar12;
  last_02.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_00,last_02);
  std::operator<<((ostream *)&std::cout,"\nENDL\n\n");
  std::operator<<((ostream *)&std::cout,"Creating a new skiplist with the copy constructor:\n");
  skiplist<int,_std::less<int>_>::skiplist(&uskip,&iskip);
  std::operator<<((ostream *)&std::cout,"Reverse constant iterator\n");
  iVar6 = 0;
  if (uskip.last != (SLNode<int> *)0x0) {
    iVar6 = (uskip.last)->count + -1;
  }
  uVar10 = 1;
  iVar9 = iVar6;
  skiplist<int,_std::less<int>_>::crend(&local_1ea8,&uskip);
  first_01._8_4_ = iVar6;
  first_01._0_8_ = local_1ea8.node;
  first_01._12_4_ = iVar9;
  first_01.node._0_1_ = uVar10;
  first_01.node._1_7_ = in_stack_ffffffffffffe071;
  last_03._8_4_ = iVar5;
  last_03._0_8_ = uskip.last;
  last_03._12_4_ = iVar11;
  last_03.node._0_1_ = uVar12;
  last_03.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_01,last_03);
  std::operator<<((ostream *)&std::cout,"Deleting elements - 0 20 22\n");
  skiplist<int,_std::less<int>_>::erase(&uskip,0x14);
  skiplist<int,_std::less<int>_>::erase(&uskip,0);
  skiplist<int,_std::less<int>_>::erase(&uskip,0x16);
  std::operator<<((ostream *)&std::cout,"Forward iterator :\n");
  skiplist<int,_std::less<int>_>::begin(&local_1ec0,&uskip);
  auVar3._4_4_ = iVar9;
  auVar3._0_4_ = iVar6;
  auVar3[8] = uVar10;
  auVar3._9_7_ = in_stack_ffffffffffffe071;
  auVar3._16_8_ = 0;
  last_04._8_4_ = iVar5;
  last_04._0_8_ = uskip.last;
  last_04._12_4_ = iVar11;
  last_04.node._0_1_ = uVar12;
  last_04.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar3 << 0x40),last_04);
  std::operator<<((ostream *)&std::cout,"\nENDL\n\n");
  std::operator<<((ostream *)&std::cout,
                  "Creating a new skiplist with the copy assignment operator:\n");
  skiplist<int,_std::less<int>_>::skiplist(&yskip,&uskip);
  std::operator<<((ostream *)&std::cout,"Forward iterator :\n");
  skiplist<int,_std::less<int>_>::begin(&local_1ed8,&yskip);
  auVar4._4_4_ = iVar9;
  auVar4._0_4_ = iVar6;
  auVar4[8] = uVar10;
  auVar4._9_7_ = in_stack_ffffffffffffe071;
  auVar4._16_8_ = 0;
  last_05._8_4_ = iVar5;
  last_05._0_8_ = uskip.last;
  last_05._12_4_ = iVar11;
  last_05.node._0_1_ = uVar12;
  last_05.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar4 << 0x40),last_05);
  skiplist<int,_std::less<int>_>::~skiplist(&yskip);
  skiplist<int,_std::less<int>_>::~skiplist(&uskip);
  skiplist<int,_std::less<int>_>::~skiplist(&iskip);
  return 0;
}

Assistant:

int main() {
    skiplist<int> iskip;
    for(int i=0; i<21; i++)
    {
        if(i%2)
            iskip.insert(i%7);
        else
            iskip.insert(i+2);
    }
    std::cout << iskip;

    std::cout << "Forward iterator :\n";
    display(iskip.begin(), iskip.end());

    std::cout << "Reverse iterator:\n";
    display(iskip.rbegin(), iskip.rend());

    std::cout << "Erasing with iterators:\n";
    auto it = iskip.find(3);
    if(it != std::end(iskip)) {
        iskip.erase(it);
        std::cout << "Erased (I think?) \n";
    }
    else
        std::cout << "Something very wrong\n";

    std::cout << "Forward constant iterator :\n";
    display(iskip.cbegin(), iskip.cend());

    std::cout << "Reverse constant iterator:\n";
    display(iskip.crbegin(), iskip.crend());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy constructor:\n";

    skiplist<int> uskip(iskip);
    std::cout << "Reverse constant iterator\n";
    display(uskip.crbegin(), uskip.crend());
    std::cout << "Deleting elements - 0 20 22\n";
    uskip.erase(20);
    uskip.erase(0);
    uskip.erase(22);
    std::cout << "Forward iterator :\n";
    display(uskip.begin(), uskip.end());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy assignment operator:\n";

    skiplist<int> yskip = uskip;
    std::cout << "Forward iterator :\n";
    display(yskip.begin(), yskip.end());
}